

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multi.c
# Opt level: O2

int close_connect_only(Curl_easy *data,connectdata *conn,void *param)

{
  int iVar1;
  
  iVar1 = 0;
  if ((data->state).lastconnect_id == conn->connection_id) {
    if (conn->connect_only == '\0') {
      iVar1 = 1;
    }
    else {
      iVar1 = 1;
      Curl_conncontrol(conn,1);
    }
  }
  return iVar1;
}

Assistant:

static int close_connect_only(struct Curl_easy *data,
                              struct connectdata *conn, void *param)
{
  (void)param;
  if(data->state.lastconnect_id != conn->connection_id)
    return 0;

  if(!conn->connect_only)
    return 1;

  connclose(conn, "Removing connect-only easy handle");

  return 1;
}